

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kstring.h
# Opt level: O2

int kputc(int c,kstring_t *s)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  size_t __size;
  
  sVar3 = s->l;
  uVar1 = sVar3 + 1;
  if (uVar1 < s->m) {
    pcVar2 = s->s;
  }
  else {
    uVar1 = uVar1 >> 1 | uVar1;
    uVar1 = uVar1 >> 2 | uVar1;
    uVar1 = uVar1 >> 4 | uVar1;
    uVar1 = uVar1 >> 8 | uVar1;
    __size = (uVar1 >> 0x10 | uVar1) + 1;
    s->m = __size;
    pcVar2 = (char *)realloc(s->s,__size);
    if (pcVar2 == (char *)0x0) {
      return -1;
    }
    s->s = pcVar2;
    sVar3 = s->l;
    uVar1 = sVar3 + 1;
  }
  s->l = uVar1;
  pcVar2[sVar3] = (char)c;
  s->s[s->l] = '\0';
  return c;
}

Assistant:

static inline int kputc(int c, kstring_t *s)
{
	if (s->l + 1 >= s->m) {
		char *tmp;
		s->m = s->l + 2;
		kroundup32(s->m);
		if ((tmp = (char*)realloc(s->s, s->m)))
			s->s = tmp;
		else
			return EOF;
	}
	s->s[s->l++] = c;
	s->s[s->l] = 0;
	return c;
}